

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O3

int lj_cf_buffer_method___tostring(lua_State *L)

{
  TValue *pTVar1;
  uint64_t uVar2;
  SBufExt *pSVar3;
  GCstr *pGVar4;
  
  pSVar3 = buffer_tobuf(L);
  pTVar1 = L->top;
  pGVar4 = lj_str_new(L,pSVar3->r,(ulong)(uint)(*(int *)&pSVar3->w - (int)pSVar3->r));
  pTVar1[-1].u64 = (ulong)pGVar4 | 0xfffd800000000000;
  uVar2 = (L->glref).ptr64;
  if (*(ulong *)(uVar2 + 0x18) <= *(ulong *)(uVar2 + 0x10)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(buffer_method___tostring)	LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobuf(L);
  setstrV(L, L->top-1, lj_str_new(L, sbx->r, sbufxlen(sbx)));
  lj_gc_check(L);
  return 1;
}